

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O3

void INT_EVset_store_limit(CManager_conflict cm,EVstone stone_num,EVaction action_num,int new_limit)

{
  int *piVar1;
  _proto_action *p_Var2;
  int iVar3;
  stone_type p_Var4;
  event_item *event;
  CManager_conflict evp;
  
  p_Var4 = stone_struct(cm->evp,stone_num);
  if (p_Var4 != (stone_type)0x0) {
    p_Var2 = p_Var4->proto_actions;
    p_Var2[action_num].o.store.max_stored = new_limit;
    if (new_limit != -1) {
      if (new_limit < p_Var2[action_num].o.term.target_stone_id) {
        do {
          event = (event_item *)
                  (**(code **)(p_Var2[action_num].o.bri.remote_contact + 0x18))
                            (cm,(undefined1 *)((long)&p_Var2[action_num].o + 0x18));
          if (event == (event_item *)0x0) {
            return;
          }
          piVar1 = &p_Var2[action_num].o.term.target_stone_id;
          *piVar1 = *piVar1 + -1;
          internal_path_submit(cm,p_Var2[action_num].o.thr_bri.target_stone_id,event);
          do {
            evp = cm;
            iVar3 = process_local_actions(cm);
          } while (iVar3 != 0);
          return_event((event_path_data)evp,event);
        } while (p_Var2[action_num].o.store.max_stored < p_Var2[action_num].o.term.target_stone_id);
      }
    }
  }
  return;
}

Assistant:

void
INT_EVset_store_limit(CManager cm, EVstone stone_num, EVaction action_num, int new_limit)
{
    event_path_data evp = cm->evp;
    stone_type stone;
    proto_action *p;

    stone = stone_struct(evp, stone_num);
    if (!stone) return;

    p = &stone->proto_actions[action_num];
    p->o.store.max_stored = new_limit;
    if (p->o.store.max_stored != -1) {
        while (p->o.store.num_stored > p->o.store.max_stored) {
            event_item *item;
            item = storage_queue_dequeue(cm, &p->o.store.queue);
            if (!item)
                break;
            p->o.store.num_stored--;
            internal_path_submit(cm, p->o.store.target_stone_id, item);
            while (process_local_actions(cm));
            return_event(evp, item);
        }
    }
}